

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O1

vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *
__thiscall
Assimp::FBX::Document::GetConnectionsSequenced
          (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *__return_storage_ptr__,Document *this,uint64_t id,ConnectionMap *conns)

{
  pointer *pppCVar1;
  iterator __position;
  __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
  __first;
  __normal_iterator<const_Assimp::FBX::Connection_**,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
  __last;
  long lVar2;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp;
  _Iter_comp_iter<std::_Mem_fn<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const>_>
  __comp_00;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> _Var3;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_> _Var4;
  ulong uVar5;
  undefined8 unaff_RBX;
  size_type __n;
  const_iterator it;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
  pVar6;
  
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar6 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::FBX::Connection_*>_>_>
          ::equal_range(&conns->_M_t,(key_type_conflict1 *)&stack0xffffffffffffffd8);
  _Var4 = pVar6.first._M_node;
  __n = 0;
  _Var3._M_node = _Var4._M_node;
  while (_Var3._M_node != pVar6.second._M_node._M_node) {
    _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node);
    __n = __n + 1;
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  reserve(__return_storage_ptr__,__n);
  for (; _Var4._M_node != pVar6.second._M_node._M_node;
      _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node)) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>::
      _M_realloc_insert<Assimp::FBX::Connection_const*const&>
                ((vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>
                  *)__return_storage_ptr__,__position,(Connection **)&_Var4._M_node[1]._M_parent);
    }
    else {
      *__position._M_current = (Connection *)_Var4._M_node[1]._M_parent;
      pppCVar1 = &(__return_storage_ptr__->
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  __first._M_current =
       (__return_storage_ptr__->
       super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->
       super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar5 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._8_8_ = unaff_RBX;
    __comp._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._M_pmf = id;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
              (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp);
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._8_8_ = unaff_RBX;
    __comp_00._M_comp.
    super__Mem_fn_base<bool_(Assimp::FBX::Connection::*)(const_Assimp::FBX::Connection_*)_const,_true>
    ._M_pmf = id;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::FBX::Connection_const**,std::vector<Assimp::FBX::Connection_const*,std::allocator<Assimp::FBX::Connection_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Mem_fn<bool(Assimp::FBX::Connection::*)(Assimp::FBX::Connection_const*)const>>>
              (__first,__last,__comp_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Connection*> Document::GetConnectionsSequenced(uint64_t id, const ConnectionMap& conns) const
{
    std::vector<const Connection*> temp;

    const std::pair<ConnectionMap::const_iterator,ConnectionMap::const_iterator> range =
        conns.equal_range(id);

    temp.reserve(std::distance(range.first,range.second));
    for (ConnectionMap::const_iterator it = range.first; it != range.second; ++it) {
        temp.push_back((*it).second);
    }

    std::sort(temp.begin(), temp.end(), std::mem_fn(&Connection::Compare));

    return temp; // NRVO should handle this
}